

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  SessionHandle *data;
  curl_sockopt_callback p_Var1;
  undefined8 uVar2;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  if2ip_result_t iVar8;
  size_t sVar9;
  uint *puVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  ushort uVar16;
  SessionHandle *pSVar17;
  bool bVar18;
  timeval tVar19;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  int optval;
  CURLcode local_2c0;
  uint local_2bc;
  uint local_2b8;
  int local_2b4;
  SessionHandle *local_2b0;
  char *local_2a8;
  Curl_dns_entry *local_2a0;
  uint local_294;
  undefined4 local_290;
  socklen_t local_28c;
  sockaddr local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  long local_200;
  char local_1f8 [48];
  undefined1 local_1c8 [144];
  sockaddr local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  data = conn->data;
  *sockp = -1;
  CVar4 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_1c8,(curl_socket_t *)&local_2bc);
  if (CVar4 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var3 = getaddressinfo((sockaddr *)(local_1c8 + 0x10),local_1f8,&local_200);
  if (!_Var3) {
    puVar10 = (uint *)__errno_location();
    uVar7 = *puVar10;
    pcVar14 = Curl_strerror(conn,uVar7);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar7,pcVar14);
    Curl_closesocket(conn,local_2bc);
    return CURLE_OK;
  }
  iVar6 = 0;
  Curl_infof(data,"  Trying %s...\n",local_1f8);
  uVar2 = local_138._0_8_;
  if ((local_1c8._0_4_ == 2) && (local_1c8._4_4_ == 1)) {
    if ((data->set).tcp_nodelay == true) {
      pSVar17 = conn->data;
      local_138._1_3_ = 0;
      local_138.sa_family._0_1_ = (pSVar17->set).tcp_nodelay;
      local_138.sa_data._2_4_ = SUB84(uVar2,4);
      iVar5 = setsockopt(local_2bc,6,1,&local_138,4);
      if (iVar5 < 0) {
        piVar12 = __errno_location();
        pcVar14 = Curl_strerror(conn,*piVar12);
        Curl_infof(pSVar17,"Could not set TCP_NODELAY: %s\n",pcVar14);
      }
      else {
        Curl_infof(pSVar17,"TCP_NODELAY set\n");
      }
    }
    uVar7 = local_2bc;
    if ((data->set).tcp_keepalive == true) {
      uVar13 = (ulong)local_2bc;
      local_138._0_4_ = 1;
      iVar5 = setsockopt(local_2bc,1,9,&local_138,4);
      if (iVar5 < 0) {
        pcVar14 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar5 = curlx_sltosi((data->set).tcp_keepidle);
        local_138._0_4_ = iVar5;
        iVar5 = setsockopt(uVar7,6,4,&local_138,4);
        if (iVar5 < 0) {
          Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d\n",uVar13);
        }
        iVar5 = curlx_sltosi((data->set).tcp_keepintvl);
        local_138._0_4_ = iVar5;
        iVar5 = setsockopt(uVar7,6,5,&local_138,4);
        if (-1 < iVar5) goto LAB_004bf9fd;
        pcVar14 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(data,pcVar14,uVar13);
    }
  }
LAB_004bf9fd:
  uVar7 = local_2bc;
  p_Var1 = (data->set).fsockopt;
  if ((p_Var1 == (curl_sockopt_callback)0x0) ||
     (iVar6 = (*p_Var1)((data->set).sockopt_client,local_2bc,CURLSOCKTYPE_IPCXN), iVar6 == 0)) {
    local_290 = 0;
  }
  else {
    local_290 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar6 >> 8),1);
    if (iVar6 != 2) {
      Curl_closesocket(conn,uVar7);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  if (local_1c8._0_4_ != 2) goto LAB_004bfe76;
  local_2b8 = local_2bc;
  local_2b4 = iVar6;
  uVar7 = Curl_ipv6_scope((sockaddr *)(local_1c8 + 0x10));
  pSVar17 = conn->data;
  local_2a0 = (Curl_dns_entry *)0x0;
  uVar16 = (pSVar17->set).localport;
  pcVar14 = (pSVar17->set).str[5];
  CVar4 = CURLE_OK;
  if (uVar16 != 0 || pcVar14 != (char *)0x0) {
    iVar6 = (pSVar17->set).localportrange;
    local_218 = 0;
    uStack_210 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_238 = 0;
    uStack_230 = 0;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = 0;
    uStack_250 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_288.sa_family = 0;
    local_288.sa_data[0] = '\0';
    local_288.sa_data[1] = '\0';
    local_288.sa_data[2] = '\0';
    local_288.sa_data[3] = '\0';
    local_288.sa_data[4] = '\0';
    local_288.sa_data[5] = '\0';
    local_288.sa_data[6] = '\0';
    local_288.sa_data[7] = '\0';
    local_288.sa_data[8] = '\0';
    local_288.sa_data[9] = '\0';
    local_288.sa_data[10] = '\0';
    local_288.sa_data[0xb] = '\0';
    local_288.sa_data[0xc] = '\0';
    local_288.sa_data[0xd] = '\0';
    local_2b0 = pSVar17;
    if ((pcVar14 == (char *)0x0) || (sVar9 = strlen(pcVar14), 0xfe < sVar9)) {
      local_288.sa_data._0_2_ = uVar16 << 8 | uVar16 >> 8;
      local_288.sa_family = 2;
      local_2c0 = CURLE_HTTP2;
    }
    else {
      memset(&local_138,0,0x100);
      pcVar15 = pcVar14;
      iVar5 = strncmp("if!",pcVar14,3);
      if (iVar5 == 0) {
        uVar13 = CONCAT71((int7)((ulong)pcVar15 >> 8),1);
        bVar18 = false;
        lVar11 = 3;
      }
      else {
        iVar5 = strncmp("host!",pcVar14,5);
        bVar18 = iVar5 == 0;
        lVar11 = (ulong)bVar18 * 5;
        uVar13 = 0;
      }
      pcVar14 = pcVar14 + lVar11;
      local_2a8 = pcVar14;
      if (bVar18) {
        CVar4 = CURLE_OK;
LAB_004bfcb4:
        if ((char)uVar13 == '\0') {
          lVar11 = conn->ip_version;
          conn->ip_version = 1;
          Curl_resolv(conn,pcVar14,0,&local_2a0);
          conn->ip_version = lVar11;
          if (local_2a0 == (Curl_dns_entry *)0x0) {
            CVar4 = ~CURLE_OK;
            pcVar14 = local_2a8;
          }
          else {
            Curl_printable_address(local_2a0->addr,(char *)&local_138,0x100);
            pSVar17 = local_2b0;
            Curl_infof(local_2b0,"Name \'%s\' family %i resolved to \'%s\' family %i\n",local_2a8,2,
                       &local_138,(ulong)(uint)local_2a0->addr->ai_family);
            Curl_resolv_unlock(pSVar17,local_2a0);
            CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
            pcVar14 = local_2a8;
          }
        }
        local_2c0 = CURLE_OK;
        if (0 < (int)CVar4) {
          iVar5 = inet_pton(2,(char *)&local_138,local_288.sa_data + 2);
          local_2c0 = CURLE_OK;
          pcVar14 = local_2a8;
          if (0 < iVar5) {
            local_288.sa_data._0_2_ = uVar16 << 8 | uVar16 >> 8;
            local_288.sa_family = 2;
            local_2c0 = CURLE_HTTP2;
          }
        }
        if ((int)CVar4 < 1) {
          pcVar15 = "Couldn\'t bind to \'%s\'";
LAB_004bfe21:
          Curl_failf(local_2b0,pcVar15,pcVar14);
          bVar18 = false;
          CVar4 = CURLE_INTERFACE_FAILED;
        }
        else {
          bVar18 = true;
        }
      }
      else {
        local_294 = (uint)uVar13;
        iVar8 = Curl_if2ip(2,uVar7,conn->scope_id,pcVar14,(char *)&local_138,0x100);
        pcVar14 = local_2a8;
        if (iVar8 == IF2IP_FOUND) {
          Curl_infof(local_2b0,"Local Interface %s is ip %s using address family %i\n",local_2a8,
                     &local_138,2);
          sVar9 = strlen(pcVar14);
          iVar5 = setsockopt(local_2b8,1,0x19,pcVar14,(int)sVar9 + 1);
          if (iVar5 != 0) {
            puVar10 = (uint *)__errno_location();
            uVar7 = *puVar10;
            pcVar15 = Curl_strerror(conn,uVar7);
            Curl_infof(local_2b0,
                       "SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n",pcVar14
                       ,(ulong)uVar7,pcVar15);
          }
          uVar13 = 1;
          CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
          goto LAB_004bfcb4;
        }
        local_2c0 = CURLE_OK;
        uVar13 = (ulong)local_294;
        if (iVar8 != IF2IP_AF_NOT_SUPPORTED) {
          CVar4 = local_2c0;
          if ((iVar8 != IF2IP_NOT_FOUND) || (CVar4 = CURLE_OK, (char)local_294 == '\0'))
          goto LAB_004bfcb4;
          local_2c0 = CURLE_OK;
          pcVar15 = "Couldn\'t bind to interface \'%s\'";
          goto LAB_004bfe21;
        }
        bVar18 = false;
        CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
      }
      if (!bVar18) goto LAB_004bfe47;
    }
    iVar5 = bind(local_2b8,&local_288,local_2c0);
    while (iVar5 < 0) {
      if (iVar6 < 2) {
        puVar10 = (uint *)__errno_location();
        pSVar17 = local_2b0;
        uVar7 = *puVar10;
        (local_2b0->state).os_errno = uVar7;
        pcVar14 = Curl_strerror(conn,uVar7);
        pcVar15 = "bind failed with errno %d: %s";
        goto LAB_004bfc7c;
      }
      Curl_infof(local_2b0,"Bind to local port %hu failed, trying next\n",(ulong)uVar16);
      uVar16 = uVar16 + 1;
      if (local_288.sa_family == 2) {
        local_288.sa_data._0_2_ = uVar16 * 0x100 | uVar16 >> 8;
        local_288.sa_family = 2;
      }
      iVar5 = bind(local_2b8,&local_288,local_2c0);
      iVar6 = iVar6 + -1;
    }
    local_28c = 0x80;
    local_138.sa_family = 0;
    local_138.sa_data[0] = '\0';
    local_138.sa_data[1] = '\0';
    local_138.sa_data[2] = '\0';
    local_138.sa_data[3] = '\0';
    local_138.sa_data[4] = '\0';
    local_138.sa_data[5] = '\0';
    local_138.sa_data[6] = '\0';
    local_138.sa_data[7] = '\0';
    local_138.sa_data[8] = '\0';
    local_138.sa_data[9] = '\0';
    local_138.sa_data[10] = '\0';
    local_138.sa_data[0xb] = '\0';
    local_138.sa_data[0xc] = '\0';
    local_138.sa_data[0xd] = '\0';
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    iVar6 = getsockname(local_2b8,&local_138,&local_28c);
    if (iVar6 < 0) {
      puVar10 = (uint *)__errno_location();
      pSVar17 = local_2b0;
      uVar7 = *puVar10;
      (local_2b0->state).os_errno = uVar7;
      pcVar14 = Curl_strerror(conn,uVar7);
      pcVar15 = "getsockname() failed with errno %d: %s";
LAB_004bfc7c:
      Curl_failf(pSVar17,pcVar15,(ulong)uVar7,pcVar14);
      CVar4 = CURLE_INTERFACE_FAILED;
    }
    else {
      CVar4 = CURLE_OK;
      Curl_infof(local_2b0,"Local port: %hu\n",(ulong)uVar16);
      (conn->bits).bound = true;
    }
  }
LAB_004bfe47:
  iVar6 = local_2b4;
  if (CVar4 != CURLE_OK) {
    Curl_closesocket(conn,local_2b8);
    if (CVar4 == CURLE_UNSUPPORTED_PROTOCOL) {
      return CURLE_COULDNT_CONNECT;
    }
    return CVar4;
  }
LAB_004bfe76:
  curlx_nonblock(local_2bc,1);
  tVar19 = curlx_tvnow();
  conn->connecttime = tVar19;
  if (1 < conn->num_addr) {
    Curl_expire_latest(data,conn->timeoutms_per_addr);
  }
  if (((char)local_290 == '\0') && (conn->socktype == 1)) {
    local_2b4 = iVar6;
    iVar6 = connect(local_2bc,(sockaddr *)(local_1c8 + 0x10),local_1c8._12_4_);
    if (iVar6 == -1) {
      piVar12 = __errno_location();
      local_2b4 = *piVar12;
    }
    iVar5 = local_2b4;
    CVar4 = CURLE_OK;
    bVar18 = true;
    if (((iVar6 == -1) && (local_2b4 != 0xb)) && (local_2b4 != 0x73)) {
      pcVar14 = Curl_strerror(conn,local_2b4);
      Curl_infof(data,"Immediate connect fail for %s: %s\n",local_1f8,pcVar14);
      (data->state).os_errno = iVar5;
      Curl_closesocket(conn,local_2bc);
      bVar18 = false;
      CVar4 = CURLE_COULDNT_CONNECT;
    }
    if (bVar18) {
      *sockp = local_2bc;
    }
  }
  else {
    *sockp = local_2bc;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc;
  int error = 0;
  bool isconnected = FALSE;
  struct SessionHandle *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire_latest(data, conn->timeoutms_per_addr);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}